

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

bool __thiscall
ON_ArchivableDictionaryPrivate::TrySetValue<int>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,int *value)

{
  int iVar1;
  pointer ppVar2;
  pointer pDVar3;
  DictionaryEntryT<int,_(DictionaryEntryType)6> *this_00;
  reference piVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar5;
  unique_ptr<Entry<int>,_std::default_delete<Entry<int>_>_> local_80;
  unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>> *local_78;
  unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *entry_ptr;
  undefined1 local_68;
  void *local_50;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  r;
  int *value_local;
  wchar_t *key_local;
  ON_ArchivableDictionaryPrivate *this_local;
  
  local_50 = (void *)0x0;
  r._8_8_ = value;
  value_local = key;
  key_local = (wchar_t *)this;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  pair<const_wchar_t_*&,_std::nullptr_t,_true>(&local_48,&value_local,&local_50);
  pVar5 = std::
          map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
          ::insert(&this->m_map,&local_48);
  entry_ptr = (unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
              pVar5.first._M_node;
  local_68 = pVar5.second;
  local_38._M_node = (_Base_ptr)entry_ptr;
  r.first._M_node._0_1_ = local_68;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  ~pair(&local_48);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
           ::operator->(&local_38);
  local_78 = (unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>> *)&ppVar2->second;
  if (((byte)r.first._M_node & 1) == 0) {
    pDVar3 = std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::operator->
                       ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                        local_78);
    iVar1 = (*pDVar3->_vptr_DictionaryEntry[2])();
    if (iVar1 == 6) {
      iVar1 = *(int *)r._8_8_;
      this_00 = (DictionaryEntryT<int,_(DictionaryEntryType)6> *)
                std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::get
                          ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                           local_78);
      piVar4 = DictionaryEntryT<int,_(DictionaryEntryType)6>::Value(this_00);
      *piVar4 = iVar1;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    make_entry<int>((int *)&local_80);
    std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>::operator=
              (local_78,&local_80);
    std::unique_ptr<Entry<int>,_std::default_delete<Entry<int>_>_>::~unique_ptr(&local_80);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TrySetValue(const wchar_t* key, const V& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (r.second)
    {
      entry_ptr = make_entry(value);
      return true;
    }
    else if (entry_ptr->EntryType() == Entry<V>::Type)
    {
      static_cast<Entry<V>*>(entry_ptr.get())->Value() = value;
      return true;
    }

    return false;
  }